

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O1

int __thiscall PlatformWindowData::open(PlatformWindowData *this,char *__file,int __oflag,...)

{
  long lVar1;
  Display *pDVar2;
  int iVar3;
  uint uVar4;
  Display *pDVar5;
  Window WVar6;
  Atom AVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong in_RCX;
  long lVar10;
  int iVar11;
  char *__new;
  char *__s;
  char in_R8B;
  XVisualInfo vi;
  Hints hints;
  XSetWindowAttributes wa;
  
  uVar4 = (uint)((ulong)___oflag >> 0x20);
  iVar11 = (int)___oflag;
  puts("Creating window");
  pDVar5 = (Display *)XOpenDisplay(0);
  this->display = pDVar5;
  if (pDVar5 == (Display *)0x0) {
    uVar4 = puts("Cannot open display");
    uVar8 = (ulong)uVar4;
  }
  else {
    iVar3 = *(int *)(pDVar5 + 0xe0);
    this->screen = iVar3;
    lVar1 = *(long *)(pDVar5 + 0xe8);
    lVar10 = (long)iVar3 * 0x80;
    this->visual = *(Visual **)(lVar1 + 0x40 + lVar10);
    this->depth = *(uint *)(lVar1 + 0x38 + lVar10);
    iVar3 = XMatchVisualInfo(pDVar5,(long)iVar3,0x20,4,&vi);
    if (iVar3 == 0) {
      __s = "Visual not found! Default is used.";
    }
    else {
      this->visual = vi.visual;
      this->depth = vi.depth;
      __s = "XMatchVisual success!";
    }
    puts(__s);
    if (this->visual->c_class != 4) {
      puts("No TrueColor...");
    }
    wa.colormap = 0;
    wa.cursor = 0;
    wa.do_not_propagate_mask = 0;
    wa.override_redirect = 0;
    wa._92_4_ = 0;
    wa.save_under = 0;
    wa._68_4_ = 0;
    wa.event_mask = 0;
    wa.backing_planes = 0;
    wa.backing_pixel = 0;
    wa.bit_gravity = 0;
    wa.win_gravity = 0;
    wa.backing_store = 0;
    wa._44_4_ = 0;
    wa.border_pixmap = 0;
    wa.border_pixel = 0;
    wa.background_pixmap = 0;
    wa.background_pixel = 0;
    pDVar2 = this->display;
    wa.colormap = XCreateColormap(pDVar2,*(undefined8 *)
                                          (*(long *)(pDVar2 + 0xe8) + 0x10 +
                                          (long)*(int *)(pDVar2 + 0xe0) * 0x80),this->visual,0);
    wa.border_pixel = 0;
    wa.backing_store = 2;
    wa.background_pixmap = 0;
    printf("Depth = %i, x = %i, y = %i\n",(ulong)this->depth,iVar11,(ulong)uVar4);
    pDVar2 = this->display;
    WVar6 = XCreateWindow(pDVar2,*(undefined8 *)
                                  (*(long *)(pDVar2 + 0xe8) + 0x10 +
                                  (long)*(int *)(pDVar2 + 0xe0) * 0x80),iVar11,uVar4,
                          in_RCX & 0xffffffff,in_RCX >> 0x20,0,this->depth,1,this->visual,0x2049,&wa
                         );
    this->handle = WVar6;
    printf("handle = %ld\n",WVar6);
    this->isQuit = false;
    XSelectInput(this->display,this->handle,0xa807f);
    rename(this,__file,__new);
    (this->pos).x = iVar11;
    (this->pos).y = uVar4;
    this->last_pos = this->pos;
    (this->size).w = (int)in_RCX;
    (this->size).h = (int)(in_RCX >> 0x20);
    this->last_size = this->size;
    AVar7 = XInternAtom(this->display,"WM_PROTOCOLS",0);
    this->AWM_PROTOCOLS = AVar7;
    AVar7 = XInternAtom(this->display,"WM_DELETE_WINDOW",0);
    this->AWM_DELETE_WINDOW = AVar7;
    uVar8 = XSetWMProtocols(this->display,this->handle,&this->AWM_DELETE_WINDOW,1);
    if (in_R8B == '\0') {
      hints.flags = 2;
      hints.decorations = 0;
      uVar9 = XInternAtom(this->display,"_MOTIF_WM_HINTS",1);
      uVar8 = XChangeProperty(this->display,this->handle,uVar9,uVar9,0x20,0,&hints,5);
    }
  }
  return (int)CONCAT71((int7)(uVar8 >> 8),pDVar5 != (Display *)0x0);
}

Assistant:

bool open(std::wstring const& title_, Pos2D pos_, Size2D size_, bool Decorated_/*, bool FullScreen_*/)
	{
		printf("Creating window\n");

		display = XOpenDisplay(0);
		if(!display){ printf("Cannot open display\n"); return false; }
		screen = DefaultScreen(display);
		visual = DefaultVisual(display, screen);
		depth = DefaultDepth(display, screen);
		XVisualInfo vi;
		if( XMatchVisualInfo(display, screen, 32, TrueColor, &vi) != 0 )
		{
			visual = vi.visual;
			depth = vi.depth;
			printf("XMatchVisual success!\n");
		}
		else
		{
			printf("Visual not found! Default is used.\n");
		}

		if(visual->c_class != TrueColor)
		{
			printf("No TrueColor...\n");
		}

		XSetWindowAttributes wa{};
		wa.colormap = XCreateColormap(display, DefaultRootWindow(display), visual, AllocNone);
		//wa.background_pixel = 0;
		wa.border_pixel = 0;
		wa.backing_store = Always;
		wa.background_pixmap = None;
		//wa.override_redirect = !Decorated_ ? True : False;
		unsigned long mask = /*CWBackPixel | */CWBackPixmap | CWColormap | CWBorderPixel | CWBackingStore;// | CWOverrideRedirect;
		printf("Depth = %i, x = %i, y = %i\n", depth, pos_.x, pos_.y);
		handle = XCreateWindow(display, DefaultRootWindow(display), pos_.x, pos_.y, size_.w, size_.h, 0, depth, InputOutput, visual, mask, &wa);
		printf("handle = %ld\n", handle);
		isQuit = false;
		XSelectInput(display, handle, ExposureMask | StructureNotifyMask | SubstructureNotifyMask //| SubstructureRedirectMask // | */ResizeRedirectMask
			| KeyPressMask | KeyReleaseMask
			| ButtonPressMask | PointerMotionMask| LeaveWindowMask| EnterWindowMask| ButtonReleaseMask );
		
		rename(title_);
		last_pos = pos = pos_;
		last_size = size = size_;

		AWM_PROTOCOLS     = XInternAtom(display, "WM_PROTOCOLS", False);
		AWM_DELETE_WINDOW = XInternAtom(display, "WM_DELETE_WINDOW", False);
		XSetWMProtocols(display, handle, &AWM_DELETE_WINDOW, 1);

		if(!Decorated_)
		{
			struct Hints
			{
				unsigned long   flags;       //Functions 1, Decorations 2, InputMode 4, Status 8
				unsigned long   functions;   //None 0, All 1, Resize 2, Move 4, Minimize 8, Maximize 16, Close 32
				unsigned long   decorations; //None 0, All 1, Border 2, ResizeH 4, Title 8, Menu 16, Minimize 32, Maximize 64
				long            inputMode;   //Modeless = 0, PrimaryApplicationModal = 1, SystemModal = 2, FullApplicationModal = 3
				unsigned long   status;      //TearoffWindow 1
			};
			Hints   hints; hints.flags = 2; hints.decorations = 0;
			Atom    prop = XInternAtom(display,"_MOTIF_WM_HINTS",True);
			XChangeProperty(display, handle, prop, prop, 32, PropModeReplace, (unsigned char*)&hints, 5);
		}
		return true;
	}